

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O2

bool SearchHelper(ON_RTreeNode *a_node,ON_RTreeCapsule *a_capsule,
                 ON_RTreeSearchResultCallback *a_result)

{
  uint uVar1;
  ON_RTreeBranch *a_rect;
  int iVar2;
  bool bVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  ON_RTreeBBox *pOVar8;
  double dVar9;
  double local_50;
  double local_48 [2];
  ON_RTreeBranch *local_38;
  
  iVar2 = a_node->m_count;
  if (iVar2 < 1) {
    return true;
  }
  a_rect = a_node->m_branch;
  if (a_node->m_level < 1) {
    if (iVar2 == 1) {
      lVar4 = 8;
      uVar6 = 1;
    }
    else {
      dVar9 = DistanceToCapsuleAxisHelper(a_capsule,&a_rect->m_rect);
      uVar1 = iVar2 - 1;
      local_48[0] = dVar9;
      local_48[1] = DistanceToCapsuleAxisHelper(a_capsule,&a_rect[uVar1].m_rect);
      uVar6 = 0;
      if (local_48[1] < dVar9) {
        uVar6 = (ulong)uVar1;
      }
      iVar5 = (int)uVar6;
      dVar9 = a_capsule->m_radius;
      if (local_48[iVar5 != 0] <= dVar9) {
        bVar3 = (*a_result->m_resultCallback)
                          (a_result->m_context,(ON__INT_PTR)a_node->m_branch[uVar6].field_1.m_child)
        ;
        if (!bVar3) {
          return false;
        }
        dVar9 = a_capsule->m_radius;
      }
      if ((local_48[iVar5 == 0] <= dVar9) &&
         (bVar3 = (*a_result->m_resultCallback)
                            (a_result->m_context,
                             (ON__INT_PTR)a_node->m_branch[(int)(uVar1 - iVar5)].field_1.m_child),
         !bVar3)) {
        return false;
      }
      uVar6 = (ulong)(iVar2 - 2);
      lVar4 = 0x40;
    }
    local_50 = a_capsule->m_radius;
    pOVar8 = (ON_RTreeBBox *)((long)a_node->m_branch[0].m_rect.m_min + lVar4 + -8);
    for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
      dVar9 = DistanceToCapsuleAxisHelper(a_capsule,pOVar8);
      if (dVar9 <= local_50) {
        bVar3 = (*a_result->m_resultCallback)(a_result->m_context,(ON__INT_PTR)pOVar8[1].m_min[0]);
        if (!bVar3) break;
        local_50 = a_capsule->m_radius;
      }
      pOVar8 = (ON_RTreeBBox *)(pOVar8[1].m_min + 1);
    }
  }
  else {
    if (iVar2 == 1) {
      lVar4 = 8;
      uVar6 = 1;
    }
    else {
      dVar9 = DistanceToCapsuleAxisHelper(a_capsule,&a_rect->m_rect);
      uVar1 = iVar2 - 1;
      local_48[0] = dVar9;
      local_38 = a_rect;
      local_48[1] = DistanceToCapsuleAxisHelper(a_capsule,&a_rect[uVar1].m_rect);
      uVar6 = 0;
      if (local_48[1] < dVar9) {
        uVar6 = (ulong)uVar1;
      }
      iVar5 = (int)uVar6;
      dVar9 = a_capsule->m_radius;
      if (local_48[iVar5 != 0] <= dVar9) {
        bVar3 = SearchHelper(local_38[uVar6].field_1.m_child,a_capsule,a_result);
        if (!bVar3) {
          return false;
        }
        dVar9 = a_capsule->m_radius;
      }
      if ((local_48[iVar5 == 0] <= dVar9) &&
         (bVar3 = SearchHelper(local_38[(int)(uVar1 - iVar5)].field_1.m_child,a_capsule,a_result),
         !bVar3)) {
        return false;
      }
      uVar6 = (ulong)(iVar2 - 2);
      lVar4 = 0x40;
    }
    local_50 = a_capsule->m_radius;
    pOVar8 = (ON_RTreeBBox *)((long)a_node->m_branch[0].m_rect.m_min + lVar4 + -8);
    for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
      dVar9 = DistanceToCapsuleAxisHelper(a_capsule,pOVar8);
      if (dVar9 <= local_50) {
        bVar3 = SearchHelper((ON_RTreeNode *)pOVar8[1].m_min[0],a_capsule,a_result);
        if (!bVar3) break;
        local_50 = a_capsule->m_radius;
      }
      pOVar8 = (ON_RTreeBBox *)(pOVar8[1].m_min + 1);
    }
  }
  return uVar6 <= uVar7;
}

Assistant:

static
bool SearchHelper(const ON_RTreeNode* a_node, struct ON_RTreeCapsule* a_capsule, ON_RTreeSearchResultCallback& a_result ) 
{
  // NOTE: 
  //  Some versions of ON_RTree::Search shrink a_sphere as the search progresses.
  int i, count;
  double r[2];
  
  if ( (count = a_node->m_count) > 0 )
  {
    const ON_RTreeBranch* branch = a_node->m_branch;
    if(a_node->IsInternalNode()) 
    {
      // a_node is an internal node - search m_branch[].m_child as needed
      if ( count > 1 )
      {
        // search a closer node first to avoid worst case search times
        // in closest point style calculations
        r[0] = DistanceToCapsuleAxisHelper( a_capsule, &branch[0].m_rect );
        r[1] = DistanceToCapsuleAxisHelper( a_capsule, &branch[count-1].m_rect );
        i = ( r[0] <= r[1] ) ? 0 : count-1;
        if (    (r[i?1:0] <= a_capsule->m_radius && !SearchHelper(branch[i].m_child, a_capsule, a_result)) 
             || (r[i?0:1] <= a_capsule->m_radius && !SearchHelper(branch[count-1 - i].m_child, a_capsule, a_result))
          )
        {
          // callback canceled search
          return false;
        }
        count -= 2;
        branch++;
      }

      r[1] = a_capsule->m_radius;
      for( i = 0; i < count; ++i )
      {
        r[0] = DistanceToCapsuleAxisHelper(a_capsule, &branch[i].m_rect);
        if(r[0] <= r[1])
        {
          if(!SearchHelper(branch[i].m_child, a_capsule, a_result) )
          {
            return false; // Don't continue searching
          }
          // a_result.m_resultCallback can shrink the capsule
          r[1] = a_capsule->m_radius;
        }
      }
    }
    else
    {
      // a_node is a leaf node - return m_branch[].m_id values
      if ( count > 1 )
      {
        // search a closer node first to avoid worst case search times
        // in closest point style calculations
        r[0] = DistanceToCapsuleAxisHelper( a_capsule, &branch[0].m_rect );
        r[1] = DistanceToCapsuleAxisHelper( a_capsule, &branch[count-1].m_rect );
        i = ( r[0] <= r[1] ) ? 0 : count-1;
        if (    (r[i?1:0] <= a_capsule->m_radius && !a_result.m_resultCallback( a_result.m_context, branch[i].m_id )) 
             || (r[i?0:1] <= a_capsule->m_radius && !a_result.m_resultCallback( a_result.m_context, branch[count-1 - i].m_id ))
          )
        {
          // callback canceled search
          return false;
        }
        count -= 2;
        branch++;
      }

      r[1] = a_capsule->m_radius;
      for( i = 0; i < count; ++i)
      {
        r[0] = DistanceToCapsuleAxisHelper(a_capsule, &branch[i].m_rect);
        if(r[0] <= r[1])
        {
          if ( !a_result.m_resultCallback( a_result.m_context, branch[i].m_id ) )
          {
            // callback canceled search
            return false;
          }
          // a_result.m_resultCallback can shrink the capsule
          r[1] = a_capsule->m_radius;
        }
      }
    }
  }

  return true; // Continue searching
}